

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::addOffsetGlobal(Replacer *this,Expression *toExpr,Name memory)

{
  mapped_type *pmVar1;
  GlobalGet *left;
  Name name;
  undefined1 local_48 [8];
  Name memory_local;
  
  memory_local.super_IString.str._M_len = memory.super_IString.str._M_str;
  local_48 = memory.super_IString.str._M_len;
  pmVar1 = std::__detail::
           _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&this->parent->memoryIdxMap,(key_type *)local_48);
  name = getOffsetGlobal(this->parent,*pmVar1);
  if (name.super_IString.str._M_str != (char *)0x0) {
    memory_local.super_IString.str._M_str._4_4_ =
         Abstract::getBinary((Type)(this->parent->pointerType).id,Add);
    left = Builder::makeGlobalGet(&this->builder,name,(Type)(this->parent->pointerType).id);
    toExpr = (Expression *)
             Builder::makeBinary(&this->builder,memory_local.super_IString.str._M_str._4_4_,
                                 (Expression *)left,toExpr);
  }
  return (Expression *)(Binary *)toExpr;
}

Assistant:

Expression* addOffsetGlobal(Expression* toExpr, Name memory) {
      auto memoryIdx = parent.memoryIdxMap.at(memory);
      auto offsetGlobal = parent.getOffsetGlobal(memoryIdx);
      Expression* returnExpr;
      if (offsetGlobal) {
        returnExpr = builder.makeBinary(
          Abstract::getBinary(parent.pointerType, Abstract::Add),
          builder.makeGlobalGet(offsetGlobal, parent.pointerType),
          toExpr);
      } else {
        returnExpr = toExpr;
      }
      return returnExpr;
    }